

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

void Eso_ManStop(Eso_Man_t *p)

{
  Eso_Man_t *p_local;
  
  Vec_WecFree(p->vEsops);
  Hsh_VecManStop(p->pHash);
  Vec_WecFree(p->vCubes);
  Vec_IntFree(p->vCube1);
  Vec_IntFree(p->vCube2);
  Vec_IntFree(p->vCube);
  if (p != (Eso_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Eso_ManStop( Eso_Man_t * p )
{
    Vec_WecFree( p->vEsops );
    Hsh_VecManStop( p->pHash );
    Vec_WecFree( p->vCubes );
    Vec_IntFree( p->vCube1 );
    Vec_IntFree( p->vCube2 );
    Vec_IntFree( p->vCube );
    ABC_FREE( p );
}